

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

SstStream SstWriterOpen(char *Name,SstParams Params,SMPI_Comm comm)

{
  int *rank;
  pthread_mutex_t *__mutex;
  CPNetworkInfoFunc p_Var1;
  int iVar2;
  SstStream Stream;
  char *__s;
  CP_Info p_Var3;
  CP_DP_Interface DPInfo;
  attr_list DPAttrs;
  DP_WS_Stream pvVar4;
  char *pcVar5;
  WS_ReaderInfo Reader;
  size_t sVar6;
  char *__s_00;
  char *__s_01;
  FILE *__stream;
  char *pcVar7;
  NameListEntry *pNVar8;
  sigaction local_c8;
  
  Stream = CP_newStream();
  Stream->Role = WriterRole;
  CP_validateParams(Stream,Params,1);
  Stream->ConfigParams = Params;
  __s = strdup(Name);
  Stream->mpiComm = comm;
  rank = &Stream->Rank;
  SMPI_Comm_rank(comm,rank);
  SMPI_Comm_size(Stream->mpiComm,&Stream->CohortSize);
  p_Var3 = CP_getCPInfo(Stream->ConfigParams->ControlModule);
  Stream->CPInfo = p_Var3;
  DPInfo = SelectDP(&Svcs,Stream,Stream->ConfigParams,Stream->Rank);
  Stream->DP_Interface = DPInfo;
  if (DPInfo == (CP_DP_Interface)0x0) {
    CP_verbose(Stream,CriticalVerbose,"Failed to load DataPlane %s for Stream \"%s\"\n",
               Params->DataTransport,__s);
LAB_006be206:
    Stream = (SstStream)0x0;
  }
  else {
    FinalizeCPInfo(Stream->CPInfo,DPInfo);
    if (Stream->RendezvousReaderCount < 1) {
      iVar2 = -1;
    }
    else {
      iVar2 = CMCondition_get(Stream->CPInfo->SharedCM->cm,0);
    }
    Stream->FirstReaderCondition = iVar2;
    DPAttrs = (attr_list)create_attr_list();
    pvVar4 = (*Stream->DP_Interface->initWriter)
                       (&Svcs,Stream,Stream->ConfigParams,DPAttrs,&Stream->Stats);
    Stream->DP_Stream = pvVar4;
    if (Stream->Rank == 0) {
      if (Stream->RegistrationMethod == SstRegisterScreen) {
        pcVar5 = buildContactInfo(Stream,DPAttrs);
        fprintf(_stdout,
                "The next line of output is the contact information associated with SST output stream \"%s\".  Please make it available to the reader.\n"
                ,__s);
        fprintf(_stdout,"\t%s\n",pcVar5);
        fflush(_stdout);
        free(pcVar5);
      }
      else {
        if (Stream->RegistrationMethod != SstRegisterFile) goto LAB_006be206;
        pcVar5 = buildContactInfo(Stream,DPAttrs);
        sVar6 = strlen(__s);
        sVar6 = sVar6 + 5;
        __s_00 = (char *)malloc(sVar6);
        __s_01 = (char *)malloc(sVar6);
        snprintf(__s_00,sVar6,"%s.tmp",__s);
        sVar6 = strlen(__s);
        snprintf(__s_01,sVar6 + 5,"%s.sst",__s);
        __stream = fopen(__s_00,"w");
        if (__stream == (FILE *)0x0) {
          fprintf(_stderr,
                  "Failed to create contact file \"%s\", is directory or filesystem read-only?\n",
                  __s_01);
          return (SstStream)0x0;
        }
        fputs("#ADIOS2-SST v0\n",__stream);
        fputs(pcVar5,__stream);
        fclose(__stream);
        rename(__s_00,__s_01);
        pcVar7 = realpath(__s_01,(char *)0x0);
        Stream->AbsoluteFilename = pcVar7;
        free(pcVar5);
        free(__s_00);
        free(__s_01);
        if (AddNameToExitList_First == '\0') {
          AddNameToExitList_First = '\x01';
          atexit(RemoveAllFilesInList);
          memset(&local_c8.sa_mask,0,0x90);
          local_c8.__sigaction_handler.sa_handler = ExitAndRemoveFiles;
          sigemptyset(&local_c8.sa_mask);
          sigaction(2,&local_c8,(sigaction *)0x0);
        }
        pNVar8 = (NameListEntry *)malloc(0x10);
        pNVar8->FileName = pcVar7;
        pNVar8->Next = FileNameList;
        FileNameList = pNVar8;
      }
      if (*rank == 0) {
        CP_verbose(Stream,SummaryVerbose,"Opening Stream \"%s\"\n",__s);
        CP_verbose(Stream,SummaryVerbose,"Writer stream params are:\n");
        CP_dumpParams(Stream,Stream->ConfigParams,0);
      }
    }
    p_Var1 = globalNetinfoCallback;
    if (globalNetinfoCallback != (CPNetworkInfoFunc)0x0) {
      pcVar5 = CP_GetContactString(Stream,DPAttrs);
      (*p_Var1)(0,pcVar5,IPDiagString);
    }
    free_attr_list(DPAttrs);
    iVar2 = Stream->RendezvousReaderCount;
    __mutex = &Stream->DataLock;
    while (0 < iVar2) {
      CP_verbose(Stream,PerStepVerbose,"Stream \"%s\" waiting for %d readers\n");
      if (Stream->Rank == 0) {
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        while (Stream->ReaderRegisterQueue == (RegisterQueue)0x0) {
          pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      SMPI_Barrier(Stream->mpiComm);
      Reader = WriterParticipateInReaderOpen(Stream);
      if (Reader == (WS_ReaderInfo)0x0) {
        CP_error(Stream,"Potential reader registration failed\n");
        break;
      }
      if (Stream->ConfigParams->CPCommPattern == 1) {
        waitForReaderResponseAndSendQueued(Reader);
        SMPI_Barrier(Stream->mpiComm);
      }
      else {
        if (*rank == 0) {
          waitForReaderResponseAndSendQueued(Reader);
        }
        SMPI_Bcast(&Reader->ReaderStatus,1,SMPI_INT,0,Stream->mpiComm);
      }
      iVar2 = Stream->RendezvousReaderCount + -1;
      Stream->RendezvousReaderCount = iVar2;
    }
    gettimeofday((timeval *)&Stream->ValidStartTime,(__timezone_ptr_t)0x0);
    Stream->Filename = __s;
    Stream->Status = Established;
    CP_verbose(Stream,PerStepVerbose,"Finish opening Stream \"%s\"\n",__s);
    AddToLastCallFreeList(Stream);
  }
  return Stream;
}

Assistant:

SstStream SstWriterOpen(const char *Name, SstParams Params, SMPI_Comm comm)
{
    SstStream Stream;

    Stream = CP_newStream();
    Stream->Role = WriterRole;
    CP_validateParams(Stream, Params, 1 /* Writer */);
    Stream->ConfigParams = Params;

    char *Filename = strdup(Name);

    Stream->mpiComm = comm;

    SMPI_Comm_rank(Stream->mpiComm, &Stream->Rank);
    SMPI_Comm_size(Stream->mpiComm, &Stream->CohortSize);

    Stream->CPInfo = CP_getCPInfo(Stream->ConfigParams->ControlModule);

    //    printf("WRITER main program thread PID is %lx, TID %lx in writer
    //    open\n",
    //           (long)getpid(), (long)gettid());
    Stream->DP_Interface = SelectDP(&Svcs, Stream, Stream->ConfigParams, Stream->Rank);

    if (!Stream->DP_Interface)
    {
        CP_verbose(Stream, CriticalVerbose, "Failed to load DataPlane %s for Stream \"%s\"\n",
                   Params->DataTransport, Filename);
        return NULL;
    }

    FinalizeCPInfo(Stream->CPInfo, Stream->DP_Interface);

    if (Stream->RendezvousReaderCount > 0)
    {
        Stream->FirstReaderCondition = CMCondition_get(Stream->CPInfo->SharedCM->cm, NULL);
    }
    else
    {
        Stream->FirstReaderCondition = -1;
    }

    attr_list DPAttrs = create_attr_list();
    Stream->DP_Stream = Stream->DP_Interface->initWriter(&Svcs, Stream, Stream->ConfigParams,
                                                         DPAttrs, &Stream->Stats);

    if (Stream->Rank == 0)
    {
        if (registerContactInfo(Filename, Stream, DPAttrs) == 0)
            return NULL;
    }

    if (Stream->Rank == 0)
    {
        CP_verbose(Stream, SummaryVerbose, "Opening Stream \"%s\"\n", Filename);
        CP_verbose(Stream, SummaryVerbose, "Writer stream params are:\n");
        CP_dumpParams(Stream, Stream->ConfigParams, 0 /* writer side */);
    }

    if (globalNetinfoCallback)
    {
        (globalNetinfoCallback)(0, CP_GetContactString(Stream, DPAttrs), IPDiagString);
    }
    free_attr_list(DPAttrs);
    while (Stream->RendezvousReaderCount > 0)
    {
        WS_ReaderInfo reader;
        CP_verbose(Stream, PerStepVerbose, "Stream \"%s\" waiting for %d readers\n", Filename,
                   Stream->RendezvousReaderCount);
        if (Stream->Rank == 0)
        {
            STREAM_MUTEX_LOCK(Stream);
            while (Stream->ReaderRegisterQueue == NULL)
            {
                STREAM_CONDITION_WAIT(Stream);
            }
            STREAM_MUTEX_UNLOCK(Stream);
        }
        SMPI_Barrier(Stream->mpiComm);

        reader = WriterParticipateInReaderOpen(Stream);
        if (!reader)
        {
            CP_error(Stream, "Potential reader registration failed\n");
            break;
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
        {
            waitForReaderResponseAndSendQueued(reader);
            SMPI_Barrier(Stream->mpiComm);
        }
        else
        {
            if (Stream->Rank == 0)
            {
                waitForReaderResponseAndSendQueued(reader);
                SMPI_Bcast(&reader->ReaderStatus, 1, SMPI_INT, 0, Stream->mpiComm);
            }
            else
            {
                SMPI_Bcast(&reader->ReaderStatus, 1, SMPI_INT, 0, Stream->mpiComm);
            }
        }
        Stream->RendezvousReaderCount--;
    }
    gettimeofday(&Stream->ValidStartTime, NULL);
    Stream->Filename = Filename;
    Stream->Status = Established;
    CP_verbose(Stream, PerStepVerbose, "Finish opening Stream \"%s\"\n", Filename);
    AddToLastCallFreeList(Stream);
    return Stream;
}